

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::MarkMemory(uint number)

{
  uint number_local;
  
  if (number < 2) {
    currentMark = number;
    Tree<NULLC::Range>::for_each((Tree<NULLC::Range> *)bigBlocks,MarkBlock);
    ObjectBlockPool<8,_8192>::Mark((ObjectBlockPool<8,_8192> *)pool8,number);
    ObjectBlockPool<16,_4096>::Mark((ObjectBlockPool<16,_4096> *)pool16,number);
    ObjectBlockPool<32,_2048>::Mark((ObjectBlockPool<32,_2048> *)pool32,number);
    ObjectBlockPool<64,_1024>::Mark((ObjectBlockPool<64,_1024> *)pool64,number);
    ObjectBlockPool<128,_512>::Mark((ObjectBlockPool<128,_512> *)pool128,number);
    ObjectBlockPool<256,_256>::Mark((ObjectBlockPool<256,_256> *)pool256,number);
    ObjectBlockPool<512,_128>::Mark((ObjectBlockPool<512,_128> *)pool512,number);
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0x229,"void NULLC::MarkMemory(unsigned int)");
}

Assistant:

void NULLC::MarkMemory(unsigned int number)
{
	assert(number <= 1);

	currentMark = number;

	bigBlocks.for_each(MarkBlock);

	pool8.Mark(number);
	pool16.Mark(number);
	pool32.Mark(number);
	pool64.Mark(number);
	pool128.Mark(number);
	pool256.Mark(number);
	pool512.Mark(number);
}